

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_memory.cpp
# Opt level: O3

ObjInfo * __thiscall GCHeap::find(GCHeap *this,void *ptr)

{
  ObjInfo *pOVar1;
  ObjInfo *pOVar2;
  ObjInfo *pOVar3;
  
  pthread_mutex_lock((pthread_mutex_t *)&Mutex::mCriticalSection);
  pOVar1 = (ObjInfo *)(this->mObjects).mList.mHead.mNext;
  pOVar2 = (ObjInfo *)0x0;
  pOVar3 = pOVar2;
  if (pOVar1 != (ObjInfo *)0x0 && pOVar1 != (ObjInfo *)&(this->mObjects).mList.mTail) {
    do {
      if (((pOVar1->ptr <= ptr) &&
          (pOVar3 = pOVar1, ptr < (void *)((long)pOVar1->ptr + (ulong)pOVar1->size))) ||
         (pOVar1 = (ObjInfo *)(pOVar1->super_Node).mNext, pOVar3 = pOVar2,
         (pOVar1->super_Node).mNext == (Node *)0x0)) break;
    } while (pOVar1 != (ObjInfo *)0x0);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&Mutex::mCriticalSection);
  return pOVar3;
}

Assistant:

GCHeap::ObjInfo *GCHeap::find( void *ptr )
{
	Mutex::EnterCriticalSection();
	ObjInfo *obj = mObjects.getHead();
	while ( obj != NULL )
	{
		if ( ptr >= obj->ptr && (uint8_t*)ptr < (uint8_t*)obj->ptr + obj->size )
		{
			Mutex::ExitCriticalSection();
			return obj;
		}

		obj = mObjects.next( obj );
	}

	Mutex::ExitCriticalSection();

	return NULL;
}